

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.h
# Opt level: O3

void __thiscall Minisat::BoolOption::printOptions(BoolOption *this,FILE *pcsFile,int granularity)

{
  int iVar1;
  char *pcVar2;
  
  pcVar2 = strstr((this->super_Option).name,"debug");
  if (pcVar2 == (char *)0x0) {
    pcVar2 = strstr((this->super_Option).description,"debug");
    if (pcVar2 == (char *)0x0) {
      iVar1 = (*(this->super_Option)._vptr_Option[10])(this);
      if ((char)iVar1 != '\0') {
        pcVar2 = "no";
        if (this->value != false) {
          pcVar2 = "yes";
        }
        fprintf((FILE *)pcsFile,"%s  {yes,no} [%s]     # %s\n",(this->super_Option).name,pcVar2,
                (this->super_Option).description);
        return;
      }
    }
  }
  return;
}

Assistant:

void printOptions(FILE *pcsFile, int granularity)
    {

        if (strstr(name, "debug") != 0 || strstr(description, "debug") != 0) {
            return;
        } // do not print the parameter, if its related to debug output
        if (!wouldPrintOption()) {
            return;
        } // do not print option?

        fprintf(pcsFile, "%s  {yes,no} [%s]     # %s\n", name, value ? "yes" : "no", description);
    }